

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O2

void handlePost(int argc,char **argv,Configuration *config)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  string name;
  string event;
  Q q;
  string local_108;
  string command;
  Args args;
  
  args._options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._options._M_t._M_impl.super__Rb_tree_header._M_header;
  args._options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._options._M_t._M_impl._0_8_ = 0;
  args._options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header;
  args._options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._optionCount._M_t._M_impl._0_8_ = 0;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._named._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._named._M_t._M_impl.super__Rb_tree_header._M_header;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._named._M_t._M_impl._0_8_ = 0;
  args._named._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._named._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  args._named._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._named._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args._positionals.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args._limit = -1;
  args._negatives = false;
  args._options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._optionCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  args._named._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._named._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Args::limitPositionals(&args,3);
  Args::scan(&args,argc,argv);
  iVar2 = Args::getPositionalCount(&args);
  if (iVar2 == 1) {
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar4,"Queue name required.",(allocator *)&q);
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar2 = Args::getPositionalCount(&args);
  if (iVar2 == 2) {
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar4,"Event file required.",(allocator *)&q);
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Args::getPositional_abi_cxx11_(&command,&args,0);
  Args::getPositional_abi_cxx11_(&name,&args,1);
  Args::getPositional_abi_cxx11_(&event,&args,2);
  bVar1 = std::operator==(&name,"");
  if (bVar1) {
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar4,"Queue name required.",(allocator *)&q);
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar1 = std::operator==(&event,"");
  if (!bVar1) {
    Q::Q(&q);
    getQueueLocation(&local_108,config,&name);
    Q::create(&q,&name,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    Q::post(&q,&event);
    poVar3 = std::operator<<((ostream *)&std::cout,"Central posted event to queue ");
    poVar3 = std::operator<<(poVar3,(string *)&name);
    std::operator<<(poVar3,".\n");
    Q::~Q(&q);
    std::__cxx11::string::~string((string *)&event);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&command);
    Args::~Args(&args);
    return;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(psVar4,"Event file required.",(allocator *)&q);
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void handlePost (
  int argc,
  const char** argv,
  Configuration& config)
{
  // Process arguments;
  Args args;
  args.limitPositionals (3);         // post <name> <event>
  args.scan (argc, argv);

  if (args.getPositionalCount () == 1)
    throw std::string ("Queue name required.");

  else if (args.getPositionalCount () == 2)
    throw std::string ("Event file required.");

  auto command = args.getPositional (0);
  auto name    = args.getPositional (1);
  auto event   = args.getPositional (2);

  // Validate arguments.
  if (name == "")
    throw std::string ("Queue name required.");

  if (event == "")
    throw std::string ("Event file required.");

  Q q;
  q.create (name, getQueueLocation (config, name));
  q.post (event);

  std::cout << "Central posted event to queue "
            << name
            << ".\n";
}